

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

size_t jessilib::find<char,char,false>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_substring)

{
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  char32_t in_codepoint;
  char *pcVar5;
  decode_result dVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  decode_result prefix_front;
  undefined4 uStack_84;
  undefined1 local_78 [8];
  decode_result string_front;
  basic_string_view<char,_std::char_traits<char>_> substring;
  basic_string_view<char,_std::char_traits<char>_> string;
  size_t codepoints_removed;
  undefined1 local_30 [8];
  basic_string_view<char,_std::char_traits<char>_> in_substring_local;
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  
  pcVar5 = in_substring._M_str;
  local_30 = (undefined1  [8])in_substring._M_len;
  in_string_02._M_len = in_string._M_str;
  in_substring_local._M_str = (char *)in_string._M_len;
  in_substring_local._M_len = (size_t)pcVar5;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  in_codepoint = (char32_t)pcVar5;
  if (bVar1) {
    in_string_local._M_str = (char *)0x0;
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       &in_substring_local._M_str);
    if (bVar1) {
      in_string_local._M_str = (char *)0xffffffffffffffff;
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      pcVar5 = in_substring_local._M_str;
      if (sVar2 == 1) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
        in_string_02._M_str._0_4_ = (int)*pvVar3;
        in_string_02._M_str._4_4_ = 0;
        in_string_local._M_str =
             (char *)find<char,false>((jessilib *)pcVar5,in_string_02,in_codepoint);
      }
      else {
        string._M_str = (char *)0x0;
        while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &in_substring_local._M_str), ((bVar1 ^ 0xffU) & 1) != 0) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &in_substring_local._M_str);
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          if (sVar2 < sVar4) {
            return 0xffffffffffffffff;
          }
          substring._M_str = in_substring_local._M_str;
          string_front.units = (size_t)local_30;
          substring._M_len = in_substring_local._M_len;
          decode_result::decode_result((decode_result *)local_78);
          do {
            in_string_01._M_str = in_string_02._M_len;
            in_string_01._M_len = (size_t)substring._M_str;
            dVar6 = decode_codepoint<char>(in_string_01);
            string_front._0_8_ = dVar6.units;
            local_78._4_4_ = uStack_84;
            local_78._0_4_ = dVar6.codepoint;
            in_string_00._M_str = (char *)substring._M_len;
            in_string_00._M_len = string_front.units;
            dVar6 = decode_codepoint<char>(in_string_00);
            if ((string_front._0_8_ == 0) || (dVar6.units == 0)) {
              return 0xffffffffffffffff;
            }
            bVar1 = equalsi(local_78._0_4_,dVar6.codepoint);
            if (!bVar1) break;
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)&substring._M_str,
                       string_front._0_8_);
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)&string_front.units,
                       dVar6.units);
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &string_front.units);
            if (bVar1) {
              return (size_t)string._M_str;
            }
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)&substring._M_str
                              );
          } while (((bVar1 ^ 0xffU) & 1) != 0);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&in_substring_local._M_str,
                     string_front._0_8_);
          string._M_str = string._M_str + string_front._0_8_;
        }
        in_string_local._M_str = (char *)0xffffffffffffffff;
      }
    }
  }
  return (size_t)in_string_local._M_str;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_substring) {
	// If we're searching for nothing, then we've found it at the front
	if (in_substring.empty()) {
		return 0;
	}

	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	// TODO: expand this to cover any instance where in_substring is a single codepoint, rather than a single data unit
	if (in_substring.size() == 1) {
		return find<LhsCharT, CaseSensitive>(in_string, in_substring[0]);
	}

	// TODO: optimize for when in_substring is small and of different type, by only decoding it once

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
		if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
			if (in_string.size() < in_substring.size()) {
				return decltype(in_string)::npos;
			}
		}

		std::basic_string_view<LhsCharT> string = in_string;
		std::basic_string_view<RhsCharT> substring = in_substring;
		decode_result string_front;
		do {
			// TODO: optimize this for when in_string and in_substring are same type, by only decoding in_string, solely
			// to determine number of data units to compare
			string_front = decode_codepoint(string);
			decode_result prefix_front = decode_codepoint(substring);

			if (string_front.units == 0
				|| prefix_front.units == 0) {
				// Failed to decode front codepoint; bad unicode sequence
				return decltype(in_string)::npos;
			}

			if constexpr (CaseSensitive) {
				if (string_front.codepoint != prefix_front.codepoint) {
					// Codepoints aren't the same; break & try next position
					break;
				}
			}
			else {
				if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
					// Codepoints don't fold the same; break & try next position
					break;
				}
			}

			// Codepoints are equal; trim off the fronts and continue
			string.remove_prefix(string_front.units);
			substring.remove_prefix(prefix_front.units);

			if (substring.empty()) {
				// We found the substring! We can return our current position
				return codepoints_removed;
			}
		} while (!string.empty());

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}